

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
::NewKey(TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
         *this,FPortalID *key)

{
  bool bVar1;
  Node *pNVar2;
  FPortalID local_68;
  FPortalID local_58;
  Node *local_48;
  Node *n;
  Node *othern;
  Node *local_28;
  Node *mp;
  FPortalID *key_local;
  TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
  *this_local;
  
  mp = (Node *)key;
  key_local = (FPortalID *)this;
  FPortalID::FPortalID((FPortalID *)&othern,key);
  local_28 = MainPosition(this,(FPortalID *)&othern);
  bVar1 = Node::IsNil(local_28);
  if (bVar1) {
    local_28->Next = (Node *)0x0;
  }
  else {
    local_48 = GetFreePos(this);
    if (local_48 == (Node *)0x0) {
      Rehash(this);
      FPortalID::FPortalID(&local_58,key);
      pNVar2 = NewKey(this,&local_58);
      return pNVar2;
    }
    FPortalID::FPortalID(&local_68,&(local_28->Pair).Key);
    n = MainPosition(this,&local_68);
    if (n == local_28) {
      local_48->Next = local_28->Next;
      local_28->Next = local_48;
      local_28 = local_48;
    }
    else {
      for (; n->Next != local_28; n = n->Next) {
      }
      n->Next = local_48;
      CopyNode(this,local_48,local_28);
      local_28->Next = (Node *)0x0;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  FPortalID::FPortalID(&(local_28->Pair).Key,key);
  return local_28;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}